

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_frame.cpp
# Opt level: O2

MPP_RET mpp_frame_init(MppFrame *frame)

{
  undefined8 *puVar1;
  char *fmt;
  
  if (frame == (MppFrame *)0x0) {
    fmt = "invalid NULL pointer input\n";
  }
  else {
    puVar1 = (undefined8 *)mpp_mem_pool_get_f("mpp_frame_init",mpp_frame_pool);
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = "mpp_frame";
      *(undefined8 *)((long)puVar1 + 0x54) = 0x200000000;
      *(undefined8 *)((long)puVar1 + 0x5c) = 0x200000002;
      *frame = puVar1;
      return MPP_OK;
    }
    fmt = "malloc failed\n";
  }
  _mpp_log_l(2,"mpp_frame",fmt,"mpp_frame_init");
  return MPP_ERR_NULL_PTR;
}

Assistant:

MPP_RET mpp_frame_init(MppFrame *frame)
{
    if (NULL == frame) {
        mpp_err_f("invalid NULL pointer input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppFrameImpl *p = (MppFrameImpl*)mpp_mem_pool_get(mpp_frame_pool);
    if (NULL == p) {
        mpp_err_f("malloc failed\n");
        return MPP_ERR_NULL_PTR;
    }

    setup_mpp_frame_name(p);
    setup_mpp_frame_defaults(p);
    *frame = p;

    return MPP_OK;
}